

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ToolBarLayout::setGeometry(ToolBarLayout *this,QRect *rect)

{
  uint uVar1;
  QLayoutItem *pQVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  Orientation OVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  int local_a0;
  int local_9c;
  ulong local_98;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  undefined8 local_48;
  int local_3c;
  QRect *local_38;
  
  QLayout::setGeometry((QRect *)this);
  auVar19 = QLayout::contentsMargins();
  if ((((this->buttons).d.size != 0) && (this->left != (QWidgetItem *)0x0)) &&
     (this->right != (QWidgetItem *)0x0)) {
    iVar15 = rect->x1 + auVar19._0_4_;
    uVar18 = auVar19._4_4_ + rect->y1;
    local_9c = rect->x2;
    local_a0 = rect->y2;
    if (this->offset < 0) {
      this->offset = 0;
    }
    local_9c = local_9c - auVar19._8_4_;
    local_a0 = local_a0 - auVar19._12_4_;
    local_98 = (**(code **)(*(long *)this->left + 0x10))();
    local_48 = (**(code **)(*(long *)this->right + 0x10))();
    iVar13 = (int)(local_98 >> 0x20);
    iVar12 = (int)local_98;
    if (this->orient == Horizontal) {
      iVar9 = (local_a0 - uVar18) - iVar13;
      uVar17 = (ulong)(((iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1) + uVar18);
      iVar9 = iVar15;
    }
    else {
      iVar9 = (local_9c - iVar15) - iVar12;
      iVar9 = ((iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1) + iVar15;
      uVar17 = (ulong)uVar18;
    }
    local_3c = this->offset;
    local_38 = rect;
    if (local_3c < 1) {
      local_78 = 0;
      iStack_74 = 0;
      iStack_70 = -1;
      iStack_6c = -1;
      (**(code **)(*(long *)this->left + 0x30))();
      local_98 = 0;
      local_58 = 0;
      iVar9 = iVar15;
      local_60 = (ulong)uVar18;
    }
    else {
      iVar7 = (int)uVar17;
      iStack_70 = iVar12 + iVar9 + -1;
      iStack_6c = iVar13 + -1 + iVar7;
      local_78 = iVar9;
      iStack_74 = iVar7;
      (**(code **)(*(long *)this->left + 0x30))();
      OVar11 = this->orient;
      iVar5 = (**(code **)(*(long *)this + 0x60))(this);
      local_58 = local_98 >> 0x20;
      if (OVar11 == Horizontal) {
        iVar9 = iVar9 + iVar12 + iVar5;
        local_60 = uVar17;
      }
      else {
        local_60 = (ulong)(uint)(iVar7 + iVar13 + iVar5);
      }
    }
    local_50 = (**(code **)(*(long *)*(this->buttons).d.ptr + 0x10))();
    iVar12 = (int)(local_50 >> 0x20);
    iVar13 = iVar12;
    if (this->orient == Horizontal) {
      iVar13 = (int)local_50;
    }
    iVar5 = (**(code **)(*(long *)this + 0x60))(this);
    iVar5 = iVar5 + iVar13;
    iVar13 = this->offset;
    uVar17 = 0;
    if (iVar5 <= iVar13) {
      uVar17 = 0;
      do {
        pQVar2 = (this->buttons).d.ptr[uVar17];
        local_78 = 0;
        iStack_74 = 0;
        iStack_70 = -1;
        iStack_6c = -1;
        (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&local_78);
        uVar17 = uVar17 + 1;
        iVar13 = iVar13 - iVar5;
      } while (iVar5 <= iVar13);
    }
    uVar16 = (uint)uVar17;
    iVar13 = this->offset % iVar5;
    if (this->orient == Horizontal) {
      iVar13 = iVar13 + iVar9;
      iVar10 = (local_9c + 1) - ((int)local_98 + iVar15);
      iVar10 = iVar10 - iVar10 % iVar5;
      iVar9 = (int)((local_a0 + 1) - (iVar12 + uVar18)) / 2 + uVar18;
      iVar7 = iVar13;
    }
    else {
      iVar13 = iVar13 + (int)local_60;
      iVar10 = (local_a0 + 1) - ((int)local_58 + uVar18);
      iVar10 = iVar10 - iVar10 % iVar5;
      iVar7 = ((local_9c + 1) - ((int)local_50 + iVar15)) / 2 + iVar15;
      iVar9 = iVar13;
    }
    local_9c = local_9c + 1;
    local_a0 = local_a0 + 1;
    iVar6 = spaceNeeded(this);
    OVar11 = this->orient;
    local_60 = CONCAT44(local_60._4_4_,local_a0 - uVar18);
    local_58 = CONCAT44(local_58._4_4_,local_9c - iVar15);
    iVar14 = local_a0 - uVar18;
    if (OVar11 == Horizontal) {
      iVar14 = local_9c - iVar15;
    }
    if (iVar6 < iVar14) {
      uVar1 = (this->align).i;
      if (((OVar11 == Horizontal & (byte)((uVar1 & 2) >> 1)) == 0) &&
         ((OVar11 == Vertical & (byte)((uVar1 & 0x40) >> 6)) == 0)) {
        if ((uVar1 & 0x84) != 0) {
          if (OVar11 == Horizontal) {
            iVar7 = (local_9c - (iVar6 + iVar15)) / 2 + iVar7;
          }
          else {
            iVar9 = (int)(local_a0 - (iVar6 + uVar18)) / 2 + iVar9;
          }
        }
      }
      else if (OVar11 == Horizontal) {
        iVar7 = (iVar7 + local_9c) - (iVar6 + iVar15);
      }
      else {
        iVar9 = (iVar9 + local_a0) - (iVar6 + uVar18);
      }
    }
    iVar14 = 0;
    if ((iVar13 < iVar10) && ((long)(uVar17 & 0xffffffff) < (this->buttons).d.size)) {
      local_50 = (ulong)((int)local_50 - 1);
      uVar17 = uVar17 & 0xffffffff;
      do {
        uVar8 = uVar17;
        iVar13 = iVar13 + iVar5;
        pQVar2 = (this->buttons).d.ptr[uVar8];
        iStack_70 = (int)local_50 + iVar7;
        iStack_6c = iVar12 + -1 + iVar9;
        local_78 = iVar7;
        iStack_74 = iVar9;
        (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&local_78);
        OVar11 = this->orient;
        iVar6 = iVar7 + iVar5;
        iVar14 = iVar5 + iVar9;
        if (iVar10 <= iVar13) break;
        iVar4 = iVar14;
        if (OVar11 == Horizontal) {
          iVar7 = iVar6;
          iVar4 = iVar9;
        }
        iVar9 = iVar4;
        uVar17 = uVar8 + 1;
      } while ((long)(uVar8 + 1) < (this->buttons).d.size);
      if (OVar11 == Horizontal) {
        iVar14 = iVar6;
      }
      uVar16 = (int)uVar8 + 1;
    }
    uVar17 = (ulong)uVar16;
    lVar3 = (this->buttons).d.size;
    if ((long)uVar17 < lVar3) {
      iVar12 = (int)((ulong)local_48 >> 0x20);
      if (OVar11 == Horizontal) {
        iVar9 = (int)local_58 - (int)local_48;
        iVar7 = (int)(local_a0 - (uVar18 + iVar12)) / 2;
        iVar10 = (int)local_58;
      }
      else {
        iVar9 = (local_9c - (iVar15 + (int)local_48)) / 2;
        iVar7 = (int)local_60 - iVar12;
        iVar10 = (int)local_60;
      }
      if (iVar10 < iVar13) {
        local_78 = 0;
        iStack_74 = 0;
        iStack_70 = 0xffffffff;
        iStack_6c = 0xffffffff;
        (**(code **)(*(long *)(this->buttons).d.ptr[uVar17 - 1] + 0x30))();
      }
      local_78 = iVar9 + iVar15;
      iStack_74 = iVar7 + uVar18;
      iStack_70 = (int)local_48 + -1 + local_78;
      iStack_6c = iVar12 + iStack_74 + -1;
      (**(code **)(*(long *)this->right + 0x30))();
      (**(code **)(*(long *)this->right + 0x68))();
      QWidget::raise();
    }
    else {
      local_78 = 0;
      iStack_74 = 0;
      iStack_70 = -1;
      iStack_6c = -1;
      (**(code **)(*(long *)this->right + 0x30))();
    }
    if ((long)uVar17 < (this->buttons).d.size) {
      do {
        pQVar2 = (this->buttons).d.ptr[uVar17];
        local_78 = 0;
        iStack_74 = 0;
        iStack_70 = -1;
        iStack_6c = -1;
        (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&local_78);
        uVar17 = uVar17 + 1;
      } while ((long)uVar17 < (this->buttons).d.size);
    }
    else if (((lVar3 <= (long)uVar17) && (0 < local_3c)) && (0 < this->offset)) {
      iVar15 = (int)local_60;
      if (this->orient == Horizontal) {
        iVar15 = (int)local_58;
      }
      if (iVar14 + iVar5 / 2 <= iVar15) {
        this->offset = 0;
        (**(code **)(*(long *)this + 0xa0))(this,local_38);
      }
    }
    (**(code **)(*(long *)this->left + 0x68))();
    QWidget::raise();
  }
  return;
}

Assistant:

void
ToolBarLayout::setGeometry( const QRect & rect )
{
	QLayout::setGeometry( rect );

	const QMargins m = contentsMargins();
	const QRect r = rect.adjusted( m.left(), m.top(), -m.right(), -m.bottom() );

	int x = r.x();
	int y = r.y();

	if( !buttons.isEmpty() && left && right )
	{
		if( offset < 0 )
			offset = 0;

		QSize leftSize = left->sizeHint();
		const QSize rightSize = right->sizeHint();

		if( orient == Qt::Horizontal )
			y = r.y() + ( r.height() - leftSize.height() ) / 2;
		else
			x = r.x() + ( r.width() - leftSize.width() ) / 2;

		// Set left arrow geometry.
		bool leftArrowShown = false;

		if( offset > 0 )
		{
			leftArrowShown = true;

			left->setGeometry( QRect( x, y, leftSize.width(), leftSize.height() ) );

			if( orient == Qt::Horizontal )
				x += leftSize.width() + spacing();
			else
				y += leftSize.height() + spacing();
		}
		else
		{
			left->setGeometry( QRect( 0, 0, 0, 0 ) );
			leftSize = QSize( 0, 0 );

			x = r.x();
			y = r.y();
		}

		const QSize buttonSize = buttons.at( 0 )->sizeHint();
		const int dim = ( orient == Qt::Horizontal ?
			buttonSize.width() : buttonSize.height() ) + spacing();
		int i = 0;
		int tmpOffset = offset;

		// Hide buttons that left on left arrow.
		while( tmpOffset >= dim )
		{
			buttons.at( i )->setGeometry( QRect( 0, 0, 0, 0 ) );

			++i;
			tmpOffset -= dim;
		}

		int stop = 0;

		// Show visible buttons.
		if( orient == Qt::Horizontal )
		{
			x += offset % dim;
			tmpOffset = x;
			stop = ( r.width() - leftSize.width() ) / dim * dim;
			y = r.y() + ( r.height() - buttonSize.height() ) / 2;
		}
		else
		{
			y += offset % dim;
			tmpOffset = y;
			stop = ( r.height() - leftSize.height() ) / dim * dim;
			x = r.x() + ( r.width() - buttonSize.width() ) / 2;
		}

		int space = spaceNeeded();

		if( space < ( orient == Qt::Horizontal ? r.width() : r.height() ) )
		{
			if( ( ( align & Qt::AlignRight ) && orient == Qt::Horizontal )
				| ( ( align & Qt::AlignBottom ) && orient == Qt::Vertical  ) )
			{
				if( orient == Qt::Horizontal )
					x += r.width() - space;
				else
					y += r.height() - space;
			}
			else if( align & Qt::AlignCenter )
			{
				if( orient == Qt::Horizontal )
					x += ( r.width() - space ) / 2;
				else
					y += ( r.height() - space ) / 2;
			}
		}

		space = 0;

		while( tmpOffset < stop && i < buttons.size() )
		{
			buttons.at( i )->setGeometry( QRect( x, y,
				buttonSize.width(), buttonSize.height() ) );

			if( orient == Qt::Horizontal )
			{
				x += dim;
				space = x;
			}
			else
			{
				y += dim;
				space = y;
			}

			tmpOffset += dim;
			++i;
		}

		// Set right arrow geometry.
		bool rightArrowShown = false;

		if( i < buttons.size() )
		{
			if( orient == Qt::Horizontal )
			{
				x = r.width() - rightSize.width() + r.x();
				y = r.y() + ( r.height() - rightSize.height() ) / 2;

				if( tmpOffset > r.width() )
					buttons.at( i - 1 )->setGeometry( QRect( 0, 0, 0, 0 ) );
			}
			else
			{
				x = r.x() + ( r.width() - rightSize.width() ) / 2;
				y = r.height() - rightSize.height() + r.y();

				if( tmpOffset > r.height() )
					buttons.at( i - 1 )->setGeometry( QRect( 0, 0, 0, 0 ) );
			}

			right->setGeometry( QRect( x, y,
				rightSize.width(), rightSize.height() ) );

			right->widget()->raise();

			rightArrowShown = true;
		}
		else
		{
			right->setGeometry( QRect( 0, 0, 0, 0 ) );
		}

		// Hide buttons that right on right arrow.
		if( i < buttons.size() )
		{
			for( ; i < buttons.size(); ++i )
				buttons.at( i )->setGeometry( QRect( 0, 0, 0, 0 ) );
		}
		else if( offset > 0 && leftArrowShown &&
			!rightArrowShown &&
			space + dim / 2 <= ( orient == Qt::Horizontal ? r.width() : r.height() ) )
		{
			offset = 0;
			setGeometry( rect );
		}

		left->widget()->raise();
	}
}